

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O2

void sw_via_0(ubyte iobyte)

{
  s_via_opb = s_via[2] & iobyte;
  current_latch = s_via_opb;
  s_via[0] = iobyte;
  s_via_latch[s_via_opb & 7] = s_via_opb & 8;
  if (((iobyte & 6) == 4) && (teletext == '\0')) {
    set_screen_start();
  }
  if ((iobyte & 7) != 0) {
    return;
  }
  sound_byte(s_via_opa);
  return;
}

Assistant:

void sw_via_0(ubyte iobyte) {
    s_via[ORB] = iobyte;
    current_latch = s_via_opb = iobyte & s_via[DDRB];
    if (iobyte == 0)
        iobyte = 0;
    s_via_latch[s_via_opb & 7] = s_via_opb & 8;

    iobyte &= 7;
    if ((iobyte == 4) || (iobyte == 5)) if (!teletext) set_screen_start();
    if (iobyte == 0) sound_byte(s_via_opa);
}